

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int refs2id(refs_t *r,SAM_hdr *h)

{
  khint_t kVar1;
  ref_entry **pprVar2;
  int local_24;
  khint_t k;
  int i;
  SAM_hdr *h_local;
  refs_t *r_local;
  
  if (r->ref_id != (ref_entry **)0x0) {
    free(r->ref_id);
  }
  if (r->last != (ref_entry *)0x0) {
    r->last = (ref_entry *)0x0;
  }
  pprVar2 = (ref_entry **)calloc((long)h->nref,8);
  r->ref_id = pprVar2;
  if (r->ref_id == (ref_entry **)0x0) {
    r_local._4_4_ = -1;
  }
  else {
    r->nref = h->nref;
    for (local_24 = 0; local_24 < h->nref; local_24 = local_24 + 1) {
      kVar1 = kh_get_refs(r->h_meta,h->ref[local_24].name);
      if (kVar1 == r->h_meta->n_buckets) {
        fprintf(_stderr,"Unable to find ref name \'%s\'\n",h->ref[local_24].name);
      }
      else {
        r->ref_id[local_24] = r->h_meta->vals[kVar1];
      }
    }
    r_local._4_4_ = 0;
  }
  return r_local._4_4_;
}

Assistant:

int refs2id(refs_t *r, SAM_hdr *h) {
    int i;

    if (r->ref_id)
	free(r->ref_id);
    if (r->last)
	r->last = NULL;

    r->ref_id = calloc(h->nref, sizeof(*r->ref_id));
    if (!r->ref_id)
	return -1;

    r->nref = h->nref;
    for (i = 0; i < h->nref; i++) {
	khint_t k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta)) {
	    r->ref_id[i] = kh_val(r->h_meta, k);
	} else {
	    fprintf(stderr, "Unable to find ref name '%s'\n",
		    h->ref[i].name);
	}
    }

    return 0;
}